

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall ON_Surface::IsSphere(ON_Surface *this,ON_Sphere *sphere,double tolerance)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ON_3dPoint point;
  ON_3dPoint point_00;
  ON_3dPoint point_01;
  ON_3dPoint point_02;
  ON_3dPoint point_03;
  ON_3dPoint point_04;
  bool bVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  void *memblock;
  long lVar11;
  ulong uVar12;
  ON_Plane *pOVar13;
  ON_Circle *pOVar14;
  ON_Sphere *pOVar15;
  byte bVar16;
  ulong uVar17;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  ON_3dPoint P;
  ON_3dPoint S;
  ON_Sphere sph1;
  ON_Sphere sph0;
  ON_Arc arc1;
  ON_Arc arc0;
  ON_3dPoint local_338;
  double local_320;
  double local_318;
  ON_3dPoint local_310;
  ON_3dPoint local_2f8;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c0;
  undefined1 local_2b8 [16];
  double local_2a8;
  uint local_29c;
  void *local_298;
  ON_Sphere *local_290;
  ulong local_288;
  ulong local_280;
  ulong local_278;
  ON_Sphere local_270;
  ON_Sphere local_1e8;
  ON_Circle local_160;
  double local_d8;
  double dStack_d0;
  ON_Circle local_c8;
  double local_40;
  double dStack_38;
  long *plVar10;
  
  bVar16 = 0;
  local_2b8._8_4_ = in_XMM0_Dc;
  local_2b8._0_8_ = tolerance;
  local_2b8._12_4_ = in_XMM0_Dd;
  bVar4 = ON_IsValid(tolerance);
  uVar18 = local_2b8._0_4_;
  uVar19 = local_2b8._4_4_;
  uVar20 = local_2b8._8_4_;
  uVar21 = local_2b8._12_4_;
  if (!bVar4) {
    uVar18 = 0;
    uVar19 = 0x3df00000;
    uVar20 = 0;
    uVar21 = 0;
  }
  uVar17 = -(ulong)(0.0 < local_2b8._0_8_);
  uVar12 = CONCAT44(uVar19,uVar18) & uVar17;
  uVar18 = (undefined4)uVar12;
  uVar19 = (undefined4)(uVar12 >> 0x20);
  uVar3 = CONCAT44(uVar21,uVar20) & local_2b8._8_8_;
  auVar22._0_8_ = ~uVar17 & 0x3df0000000000000;
  auVar22._8_8_ = 0;
  auVar2._8_4_ = (int)uVar3;
  auVar2._0_8_ = uVar12;
  auVar2._12_4_ = (int)(uVar3 >> 0x20);
  local_2b8 = auVar22 | auVar2;
  bVar4 = ON_Object::IsKindOf((ON_Object *)this,&ON_RevSurface::m_ON_RevSurface_class_rtti);
  if (bVar4) {
    bVar4 = ON_RevSurface::IsSpherical((ON_RevSurface *)this,sphere,(double)local_2b8._0_8_);
    return bVar4;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  local_c8.plane.origin.y = (double)CONCAT44(uVar19,uVar18);
  dVar1 = ON_Interval::Mid((ON_Interval *)&local_c8);
  iVar8 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(SUB84(dVar1,0),this,0);
  plVar10 = (long *)CONCAT44(extraout_var,iVar8);
  if (plVar10 == (long *)0x0) {
    return false;
  }
  pOVar13 = &ON_Plane::World_xy;
  pOVar14 = &local_c8;
  for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pOVar14->plane).origin.x = (pOVar13->origin).x;
    pOVar13 = (ON_Plane *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar14 = (ON_Circle *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  local_c8.radius = 1.0;
  local_40 = ON_Interval::ZeroToTwoPi.m_t[0];
  dStack_38 = ON_Interval::ZeroToTwoPi.m_t[1];
  uVar18 = local_2b8._0_4_;
  uVar19 = local_2b8._4_4_;
  local_2d8 = (double)(-(ulong)(2.3283064365386963e-10 < local_2b8._0_8_) & (ulong)local_2b8._0_8_);
  uStack_2d0 = 0;
  cVar5 = (**(code **)(*plVar10 + 0x180))(plVar10,0);
  (**(code **)(*plVar10 + 0x20))(plVar10);
  if (cVar5 != '\0') {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    local_160.plane.origin.y = (double)CONCAT44(uVar19,uVar18);
    dVar1 = ON_Interval::Mid((ON_Interval *)&local_160);
    iVar8 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                      (SUB84(dVar1,0),this,1);
    plVar10 = (long *)CONCAT44(extraout_var_00,iVar8);
    if (plVar10 != (long *)0x0) {
      pOVar13 = &ON_Plane::World_xy;
      pOVar14 = &local_160;
      for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pOVar14->plane).origin.x = (pOVar13->origin).x;
        pOVar13 = (ON_Plane *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
        pOVar14 = (ON_Circle *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      local_160.radius = 1.0;
      local_d8 = ON_Interval::ZeroToTwoPi.m_t[0];
      dStack_d0 = ON_Interval::ZeroToTwoPi.m_t[1];
      cVar5 = (**(code **)(*plVar10 + 0x180))(local_2d8._0_4_,plVar10,0);
      (**(code **)(*plVar10 + 0x20))(plVar10);
      if (cVar5 == '\0') {
        bVar4 = false;
      }
      else {
        local_290 = sphere;
        ON_Sphere::ON_Sphere(&local_1e8);
        pOVar14 = &local_c8;
        pOVar15 = &local_1e8;
        for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pOVar15->plane).origin.x = (pOVar14->plane).origin.x;
          pOVar14 = (ON_Circle *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
          pOVar15 = (ON_Sphere *)((long)pOVar15 + (ulong)bVar16 * -0x10 + 8);
        }
        local_1e8.radius = local_c8.radius;
        bVar6 = ON_Sphere::IsValid(&local_1e8);
        ON_Sphere::ON_Sphere(&local_270);
        pOVar14 = &local_160;
        pOVar15 = &local_270;
        for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pOVar15->plane).origin.x = (pOVar14->plane).origin.x;
          pOVar14 = (ON_Circle *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
          pOVar15 = (ON_Sphere *)((long)pOVar15 + (ulong)bVar16 * -0x10 + 8);
        }
        local_270.radius = local_160.radius;
        bVar7 = ON_Sphere::IsValid(&local_270);
        if (bVar6 || bVar7) {
          local_2d8 = (local_c8.radius + local_160.radius) * 7.450580596925e-09;
          dVar1 = 0.0;
          local_320 = 0.0;
          local_318 = 0.0;
          do {
            local_2a8 = (dVar1 + dVar1) * 3.141592653589793;
            local_2c0 = dVar1;
            ON_Circle::PointAt(&local_310,&local_c8,local_2a8);
            local_338.z = local_310.z;
            local_338.x = local_310.x;
            local_338.y = local_310.y;
            if (bVar6 != false) {
              point.y = local_310.y;
              point.x = local_310.x;
              point.z = local_310.z;
              ON_Sphere::ClosestPointTo(&local_310,&local_1e8,point);
              local_2f8.z = local_310.z;
              local_2f8.x = local_310.x;
              local_2f8.y = local_310.y;
              dVar1 = ON_3dPoint::DistanceTo(&local_2f8,&local_338);
              if (dVar1 <= local_2d8) {
                if (local_318 < dVar1) {
                  local_318 = dVar1;
                }
              }
              else {
                bVar6 = false;
                bVar4 = false;
                if (bVar7 == false) goto LAB_005a19e5;
              }
            }
            if (bVar7 != false) {
              point_00.y = local_338.y;
              point_00.x = local_338.x;
              point_00.z = local_338.z;
              ON_Sphere::ClosestPointTo(&local_310,&local_270,point_00);
              local_2f8.z = local_310.z;
              local_2f8.x = local_310.x;
              local_2f8.y = local_310.y;
              dVar1 = ON_3dPoint::DistanceTo(&local_2f8,&local_338);
              if (dVar1 <= local_2d8) {
                if (local_320 < dVar1) {
                  local_320 = dVar1;
                }
              }
              else {
                bVar7 = false;
                bVar4 = false;
                if (bVar6 == false) goto LAB_005a19e5;
              }
            }
            ON_Circle::PointAt(&local_310,&local_160,local_2a8);
            local_338.z = local_310.z;
            local_338.x = local_310.x;
            local_338.y = local_310.y;
            if (bVar6 != false) {
              point_01.y = local_310.y;
              point_01.x = local_310.x;
              point_01.z = local_310.z;
              ON_Sphere::ClosestPointTo(&local_310,&local_1e8,point_01);
              local_2f8.z = local_310.z;
              local_2f8.x = local_310.x;
              local_2f8.y = local_310.y;
              dVar1 = ON_3dPoint::DistanceTo(&local_2f8,&local_338);
              if (dVar1 <= local_2d8) {
                if (local_318 < dVar1) {
                  local_318 = dVar1;
                }
              }
              else {
                bVar6 = false;
                bVar4 = false;
                if (bVar7 == false) goto LAB_005a19e5;
              }
            }
            if (bVar7 != false) {
              point_02.y = local_338.y;
              point_02.x = local_338.x;
              point_02.z = local_338.z;
              ON_Sphere::ClosestPointTo(&local_310,&local_270,point_02);
              local_2f8.z = local_310.z;
              local_2f8.x = local_310.x;
              local_2f8.y = local_310.y;
              dVar1 = ON_3dPoint::DistanceTo(&local_2f8,&local_338);
              if (dVar1 <= local_2d8) {
                if (local_320 < dVar1) {
                  local_320 = dVar1;
                }
              }
              else {
                bVar7 = false;
                bVar4 = false;
                if (bVar6 == false) goto LAB_005a19e5;
              }
            }
            dVar1 = local_2c0 + 0.25;
          } while (dVar1 < 1.0);
          if ((bVar6 == false) && (bVar7 == false)) goto LAB_005a19e3;
          uVar9 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
          iVar8 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
          local_2c0 = (double)CONCAT44(extraout_var_01,iVar8);
          memblock = onmalloc((long)(int)(iVar8 + uVar9 + 2) << 3);
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,memblock);
          local_2a8 = (double)((long)memblock + (long)(int)uVar9 * 8 + 8);
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1);
          if (0 < (int)uVar9) {
            if (local_2b8._0_8_ <= local_2d8) {
              local_2b8._0_4_ = SUB84(local_2d8,0);
              local_2b8._4_4_ = (undefined4)((ulong)local_2d8 >> 0x20);
            }
            local_278 = (ulong)(SUB84(local_2c0,0) + 1);
            local_288 = (ulong)uVar9;
            uVar12 = 0;
            local_298 = memblock;
            do {
              uVar9 = (uint)(uVar12 != 0);
              local_280 = uVar12;
              do {
                local_2d8 = ((double)(int)(4 - uVar9) * *(double *)((long)local_298 + local_280 * 8)
                            + (double)(int)uVar9 * *(double *)((long)local_298 + local_280 * 8 + 8))
                            * 0.25;
                local_29c = uVar9;
                if (-1 < local_2c0._0_4_) {
                  uVar12 = 0;
                  do {
                    uVar9 = (uint)(uVar12 != 0);
                    iVar8 = 4 - (uint)(uVar12 != 0);
                    do {
                      PointAt(&local_310,this,local_2d8,
                              ((double)iVar8 * *(double *)((long)local_2a8 + uVar12 * 8) +
                              (double)(int)uVar9 * *(double *)((long)local_2a8 + 8 + uVar12 * 8)) *
                              0.25);
                      local_338.z = local_310.z;
                      local_338.x = local_310.x;
                      local_338.y = local_310.y;
                      if (bVar6 != false) {
                        point_03.y = local_310.y;
                        point_03.x = local_310.x;
                        point_03.z = local_310.z;
                        ON_Sphere::ClosestPointTo(&local_310,&local_1e8,point_03);
                        local_2f8.z = local_310.z;
                        local_2f8.x = local_310.x;
                        local_2f8.y = local_310.y;
                        dVar1 = ON_3dPoint::DistanceTo(&local_2f8,&local_338);
                        if (dVar1 <= (double)local_2b8._0_8_) {
                          if (local_318 < dVar1) {
                            local_318 = dVar1;
                          }
                          goto LAB_005a189b;
                        }
                        if (bVar7 != false) {
                          bVar6 = false;
                          goto LAB_005a189b;
                        }
LAB_005a19d6:
                        onfree(local_298);
                        goto LAB_005a19e3;
                      }
LAB_005a189b:
                      if (bVar7 != false) {
                        point_04.y = local_338.y;
                        point_04.x = local_338.x;
                        point_04.z = local_338.z;
                        ON_Sphere::ClosestPointTo(&local_310,&local_270,point_04);
                        local_2f8.z = local_310.z;
                        local_2f8.x = local_310.x;
                        local_2f8.y = local_310.y;
                        dVar1 = ON_3dPoint::DistanceTo(&local_2f8,&local_338);
                        if (dVar1 <= (double)local_2b8._0_8_) {
                          if (local_320 < dVar1) {
                            local_320 = dVar1;
                          }
                        }
                        else {
                          if (bVar6 == false) goto LAB_005a19d6;
                          bVar7 = false;
                        }
                      }
                      uVar9 = uVar9 + 1;
                      iVar8 = iVar8 + -1;
                    } while (uVar9 != 5);
                    uVar12 = uVar12 + 1;
                  } while (uVar12 != local_278);
                }
                uVar9 = local_29c + 1;
              } while (uVar9 != 5);
              uVar12 = local_280 + 1;
              memblock = local_298;
            } while (uVar12 != local_288);
          }
          onfree(memblock);
          bVar4 = (bool)(bVar6 | bVar7);
          if ((local_290 != (ON_Sphere *)0x0) && (bVar4 != false)) {
            pOVar15 = &local_1e8;
            if (local_320 < local_318) {
              pOVar15 = &local_270;
            }
            if (bVar7 == false) {
              pOVar15 = &local_1e8;
            }
            if (bVar6 == false) {
              pOVar15 = &local_270;
            }
            memcpy(local_290,pOVar15,0x88);
            bVar4 = true;
          }
        }
        else {
LAB_005a19e3:
          bVar4 = false;
        }
LAB_005a19e5:
        ON_Sphere::~ON_Sphere(&local_270);
        ON_Sphere::~ON_Sphere(&local_1e8);
      }
      ON_Plane::~ON_Plane(&local_160.plane);
      goto LAB_005a1a0c;
    }
  }
  bVar4 = false;
LAB_005a1a0c:
  ON_Plane::~ON_Plane(&local_c8.plane);
  return bVar4;
}

Assistant:

bool ON_Surface::IsSphere( ON_Sphere* sphere, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  if (rs)
  {
    return rs->IsSpherical(sphere,tolerance) ? true : false;
  }

  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc0;
  int bIsArc0 = crv->IsArc(0,&arc0,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc0 )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  ON_Arc arc1;
  int bIsArc1 = crv->IsArc(0,&arc1,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc1 )
    return false;

  // Determine if one of these arcs is a a portion of a 
  // great circle.

  ON_Sphere sph0;
  sph0.plane = arc0.plane;
  sph0.radius = arc0.radius;
  bool bTestSphere0 = sph0.IsValid();

  ON_Sphere sph1;
  sph1.plane = arc1.plane;
  sph1.radius = arc1.radius;
  bool bTestSphere1 = sph1.IsValid();

  if ( !bTestSphere0 && !bTestSphere1 )
    return false;

  double sph0tol = 0.0;
  double sph1tol = 0.0;

  double tol = 0.5*ON_SQRT_EPSILON*(arc0.radius+arc1.radius);

  ON_3dPoint P, S;
  double a, d;
  for ( a = 0.0; a < 1.0; a += 0.25 )
  {
    P = arc0.PointAt(a*2.0*ON_PI);
    if ( bTestSphere0 )
    {
      S = sph0.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere0 = false;
        if ( !bTestSphere1 )
          return false;
      }
      else if ( d > sph0tol )
        sph0tol = d;
    }
    if ( bTestSphere1 )
    {
      S = sph1.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere1 = false;
        if ( !bTestSphere0 )
          return false;
      }
      else if ( d > sph1tol )
        sph1tol = d;
    }

    P = arc1.PointAt(a*2.0*ON_PI);
    if ( bTestSphere0 )
    {
      S = sph0.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere0 = false;
        if ( !bTestSphere1 )
          return false;
      }
      else if ( d > sph0tol )
        sph0tol = d;
    }
    if ( bTestSphere1 )
    {
      S = sph1.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere1 = false;
        if ( !bTestSphere0 )
          return false;
      }
      else if ( d > sph1tol )
        sph1tol = d;
    }
  }
  // If the arc's are both great circles, then
  // both will be true unless we have a bug or
  // numerical issues.
  if (!bTestSphere0 && !bTestSphere1)
    return false;

  if ( tol < tolerance )
    tol = tolerance;

  double u, v;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j <= sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          if ( bTestSphere0 )
          {
            S = sph0.ClosestPointTo(P);
            d = S.DistanceTo(P);
            if ( d > tol )
            {
              bTestSphere0 = false;
              if ( !bTestSphere1 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > sph0tol )
              sph0tol = d;
          }
          if ( bTestSphere1 )
          {
            S = sph1.ClosestPointTo(P);
            d = S.DistanceTo(P);
            if ( d > tol )
            {
              bTestSphere1 = false;
              if ( !bTestSphere0 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > sph1tol )
              sph1tol = d;
          }
        }
      }
    }
  }
  onfree(s);

  bool rc = (bTestSphere0 || bTestSphere1);
  if ( rc && sphere )
  {
    if (!bTestSphere0)
      *sphere = sph1;
    else if (!bTestSphere1)
      *sphere = sph0;
    else if (sph0tol <= sph1tol)
      *sphere = sph0;
    else
      *sphere = sph1;
  }

  return rc;
}